

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

void __thiscall Time::Time(Time *this,Time *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = other->min;
  iVar2 = other->hour;
  iVar3 = other->day;
  this->sec = other->sec;
  this->min = iVar1;
  this->hour = iVar2;
  this->day = iVar3;
  iVar1 = other->year;
  iVar2 = other->wday;
  iVar3 = other->yday;
  this->month = other->month;
  this->year = iVar1;
  this->wday = iVar2;
  this->yday = iVar3;
  this->dst = other->dst;
  this->utc = other->utc;
  return;
}

Assistant:

Time::Time(const Time& other) :
  sec(other.sec),
  min(other.min),
  hour(other.hour),
  day(other.day),
  month(other.month),
  year(other.year),
  wday(other.wday),
  yday(other.yday),
  dst(other.dst),
  utc(other.utc) {}